

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::
optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
::operator=(optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
            *this,optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                  *other)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *this_00;
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  *other_local;
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  *this_local;
  
  bVar1 = has_value(this);
  if ((!bVar1) || (bVar1 = has_value(other), bVar1)) {
    bVar1 = has_value(this);
    if ((bVar1) || (bVar1 = has_value(other), !bVar1)) {
      bVar1 = has_value(this);
      if ((bVar1) && (bVar1 = has_value(other), bVar1)) {
        pvVar2 = operator*(other);
        this_00 = detail::
                  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                  ::value((storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                           *)&this->contained);
        std::
        pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
        ::operator=(this_00,pvVar2);
      }
    }
    else {
      pvVar2 = operator*(other);
      optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
      ::
      initialize<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
                ((optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
                  *)this,pvVar2);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }